

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3_174.c
# Opt level: O2

void OPL3_EnvelopeKeyOn(opl3_slot_conflict *slot,Bit8u type)

{
  byte bVar1;
  
  bVar1 = slot->key;
  if (bVar1 == 0) {
    slot->eg_gen = '\x01';
    OPL3_EnvelopeUpdateRate(slot);
    if ((slot->eg_rate & 0xfc) == 0x3c) {
      slot->eg_gen = '\x02';
      OPL3_EnvelopeUpdateRate(slot);
      slot->eg_rout = 0;
    }
    slot->pg_phase = 0;
    bVar1 = slot->key;
  }
  slot->key = bVar1 | type;
  return;
}

Assistant:

static void OPL3_EnvelopeKeyOn(opl3_slot *slot, Bit8u type)
{
    if (!slot->key)
    {
        slot->eg_gen = envelope_gen_num_attack;
        OPL3_EnvelopeUpdateRate(slot);
        if ((slot->eg_rate >> 2) == 0x0f)
        {
            slot->eg_gen = envelope_gen_num_decay;
            OPL3_EnvelopeUpdateRate(slot);
            slot->eg_rout = 0x00;
        }
        slot->pg_phase = 0x00;
    }
    slot->key |= type;
}